

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O2

int __thiscall CPORTCommand::doWhat(CPORTCommand *this,CClient *pClient)

{
  pointer pbVar1;
  EFTPSTATE EVar2;
  int iVar3;
  int iVar4;
  string ip;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  EVar2 = CClient::GetClientState(pClient);
  if ((int)EVar2 < 3) {
    std::__cxx11::string::string
              ((string *)&ip,"530 Please login with USER and PASS.\r\n",(allocator *)&ret);
    CClient::sendMsg(pClient,&ip);
  }
  else {
    if ((this->super_CCommand).m_Args._M_string_length != 0) {
      v.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      v.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      v.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&ip,",",(allocator *)&ret);
      SplitString(&(this->super_CCommand).m_Args,&v,&ip);
      std::__cxx11::string::~string((string *)&ip);
      std::operator+(&local_78,
                     v.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,".");
      std::operator+(&local_58,&local_78,
                     v.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      std::operator+(&local_38,&local_58,".");
      std::operator+(&local_98,&local_38,
                     v.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
      std::operator+(&ret,&local_98,".");
      std::operator+(&ip,&ret,v.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 3);
      std::__cxx11::string::~string((string *)&ret);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      pbVar1 = v.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar3 = atoi(v.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p);
      iVar4 = atoi(pbVar1[5]._M_dataplus._M_p);
      CClient::SetClientPortIpAndPort(pClient,&ip,iVar3 * 0x100 + iVar4);
      CClient::SetClientState(pClient,PORT);
      std::__cxx11::string::string
                ((string *)&ret,"200 PORT command successful.\r\n",(allocator *)&local_98);
      CClient::sendMsg(pClient,&ret);
      std::__cxx11::string::~string((string *)&ret);
      std::__cxx11::string::~string((string *)&ip);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&v);
      return 1;
    }
    std::__cxx11::string::string((string *)&ip,"500 Illegal PORT command.\r\n",(allocator *)&ret);
    CClient::sendMsg(pClient,&ip);
  }
  std::__cxx11::string::~string((string *)&ip);
  return -1;
}

Assistant:

int CPORTCommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        if(!m_Args.empty()){
            vector<string> v;
            SplitString(m_Args,v,",");
            string ip = v[0] + "." + v[1] + "." + v[2] + "." + v[3];
            int port = atoi(v[4].c_str()) * 256 + atoi(v[5].c_str());
            pClient->SetClientPortIpAndPort(ip,port);
            pClient->SetClientState(PORT);

            string ret = "200 PORT command successful.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        else{
            string ret = "500 Illegal PORT command.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}